

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

Guid __thiscall Jinx::Variant::GetGuid(Variant *this)

{
  bool bVar1;
  Guid GVar2;
  Variant v;
  Variant VStack_38;
  
  if (this->m_type == Guid) {
    GVar2 = (this->field_1).m_guid;
  }
  else {
    Copy(&VStack_38,this);
    bVar1 = ConvertTo(&VStack_38,Guid);
    if (bVar1) {
      GVar2 = GetGuid(&VStack_38);
    }
    else {
      GVar2 = (Guid)ZEXT816(0);
    }
    Destroy(&VStack_38);
  }
  return GVar2;
}

Assistant:

inline_t Guid Variant::GetGuid() const
	{
		if (IsGuid())
			return m_guid;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::Guid))
			return NullGuid;
		return v.GetGuid();
	}